

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structured_proto.h
# Opt level: O0

size_t absl::lts_20250127::log_internal::BufferSizeForStructuredProtoField
                 (StructuredProtoField field)

{
  __visit_result_t<BufferSizeVisitor,_std::variant<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>_&>
  _Var1;
  BufferSizeVisitor local_10;
  
  _Var1 = std::
          visit<absl::lts_20250127::log_internal::BufferSizeForStructuredProtoField(absl::lts_20250127::log_internal::StructuredProtoField)::BufferSizeVisitor,std::variant<std::variant<unsigned_long,long,unsigned_int,int,bool>,std::variant<unsigned_long,long,double>,absl::lts_20250127::Span<char_const>,std::variant<unsigned_int,int,float>>&>
                    (&local_10,
                     (variant<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
                      *)&field);
  return _Var1;
}

Assistant:

inline size_t BufferSizeForStructuredProtoField(StructuredProtoField field) {
  // Visitor to estimate the number of bytes of one of the types contained
  // inside `StructuredProtoField`.
  struct BufferSizeVisitor final {
    size_t operator()(StructuredProtoField::Varint /*unused*/) {
      return BufferSizeFor(field_number, WireType::kVarint);
    }

    size_t operator()(StructuredProtoField::I64 /*unused*/) {
      return BufferSizeFor(field_number, WireType::k64Bit);
    }

    size_t operator()(StructuredProtoField::LengthDelimited length_delimited) {
      return BufferSizeFor(field_number, WireType::kLengthDelimited) +
             length_delimited.size();
    }

    size_t operator()(StructuredProtoField::I32 /*unused*/) {
      return BufferSizeFor(field_number, WireType::k32Bit);
    }

    uint64_t field_number;
  };

  return absl::visit(BufferSizeVisitor{field.field_number}, field.value);
}